

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3VdbeRecordUnpack(KeyInfo *pKeyInfo,int nKey,void *pKey,UnpackedRecord *p)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  u32 uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  u16 uVar8;
  Mem *pMem;
  u32 local_4c;
  UnpackedRecord *local_48;
  KeyInfo *local_40;
  uint local_34;
  
  pMem = p->aMem;
  p->default_rc = '\0';
  local_48 = p;
  local_40 = pKeyInfo;
  if (*pKey < '\0') {
    bVar2 = sqlite3GetVarint32((uchar *)pKey,&local_34);
    uVar6 = (uint)bVar2;
    uVar7 = local_34;
  }
  else {
    uVar6 = 1;
    uVar7 = (int)*pKey;
  }
  uVar8 = 0;
  uVar5 = uVar7;
  do {
    if ((uVar7 <= uVar6) || ((uint)nKey < uVar5)) break;
    cVar1 = *(char *)((long)pKey + (ulong)uVar6);
    if (cVar1 < '\0') {
      bVar2 = sqlite3GetVarint32((uchar *)((ulong)uVar6 + (long)pKey),&local_4c);
      uVar3 = (uint)bVar2;
      uVar4 = local_4c;
    }
    else {
      uVar3 = 1;
      uVar4 = (int)cVar1;
    }
    uVar6 = uVar6 + uVar3;
    pMem->enc = local_40->enc;
    pMem->db = local_40->db;
    pMem->szMalloc = 0;
    pMem->z = (char *)0x0;
    uVar4 = sqlite3VdbeSerialGet((uchar *)((ulong)uVar5 + (long)pKey),uVar4,pMem);
    uVar5 = uVar5 + uVar4;
    pMem = pMem + 1;
    uVar8 = uVar8 + 1;
  } while (uVar8 < local_48->nField);
  if (uVar8 != 0 && (uint)nKey < uVar5) {
    if ((pMem[-1].flags & 0x2400) == 0) {
      pMem[-1].flags = 1;
    }
    else {
      vdbeMemClearExternAndSetNull(pMem + -1);
    }
  }
  local_48->nField = uVar8;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeRecordUnpack(
  KeyInfo *pKeyInfo,     /* Information about the record format */
  int nKey,              /* Size of the binary record */
  const void *pKey,      /* The binary record */
  UnpackedRecord *p      /* Populate this structure before returning. */
){
  const unsigned char *aKey = (const unsigned char *)pKey;
  u32 d; 
  u32 idx;                        /* Offset in aKey[] to read from */
  u16 u;                          /* Unsigned loop counter */
  u32 szHdr;
  Mem *pMem = p->aMem;

  p->default_rc = 0;
  assert( EIGHT_BYTE_ALIGNMENT(pMem) );
  idx = getVarint32(aKey, szHdr);
  d = szHdr;
  u = 0;
  while( idx<szHdr && d<=(u32)nKey ){
    u32 serial_type;

    idx += getVarint32(&aKey[idx], serial_type);
    pMem->enc = pKeyInfo->enc;
    pMem->db = pKeyInfo->db;
    /* pMem->flags = 0; // sqlite3VdbeSerialGet() will set this for us */
    pMem->szMalloc = 0;
    pMem->z = 0;
    d += sqlite3VdbeSerialGet(&aKey[d], serial_type, pMem);
    pMem++;
    if( (++u)>=p->nField ) break;
  }
  if( d>(u32)nKey && u ){
    assert( CORRUPT_DB );
    /* In a corrupt record entry, the last pMem might have been set up using 
    ** uninitialized memory. Overwrite its value with NULL, to prevent
    ** warnings from MSAN. */
    sqlite3VdbeMemSetNull(pMem-1);
  }
  assert( u<=pKeyInfo->nKeyField + 1 );
  p->nField = u;
}